

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_recursive_cte_node.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::CreatePlan(Binder *this,BoundRecursiveCTENode *node)

{
  shared_ptr<duckdb::Binder,_true> *this_00;
  shared_ptr<duckdb::Binder,_true> *this_01;
  undefined8 uVar1;
  __node_base this_02;
  Binder *pBVar2;
  pointer pBVar3;
  mapped_type *pmVar4;
  type puVar5;
  pointer pLVar6;
  InvalidInputException *this_03;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RDX;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var7;
  pointer *__ptr;
  BoundQueryNode *pBVar8;
  undefined1 uVar9;
  bool bVar10;
  undefined1 local_b8 [22];
  bool local_a2;
  LogicalOperatorType local_a1;
  undefined1 local_a0 [56];
  __buckets_ptr local_68;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_60;
  __node_base local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar10 = *(bool *)((long)&node[2].left.
                            super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
                            .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl + 1
                    );
  this_00 = (shared_ptr<duckdb::Binder,_true> *)(in_RDX + 0x16);
  local_60._M_head_impl = (LogicalOperator *)this;
  pBVar2 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
  pBVar2->is_outside_flattened = bVar10;
  bVar10 = *(bool *)((long)&node[2].left.
                            super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
                            .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl + 1
                    );
  this_01 = (shared_ptr<duckdb::Binder,_true> *)(in_RDX + 0x18);
  pBVar2 = shared_ptr<duckdb::Binder,_true>::operator->(this_01);
  pBVar2->is_outside_flattened = bVar10;
  pBVar2 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator*
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)(in_RDX + 0x10));
  CreatePlan((Binder *)(local_b8 + 8),(BoundQueryNode *)pBVar2);
  local_58._M_nxt = (_Hash_node_base *)this_01;
  pBVar2 = shared_ptr<duckdb::Binder,_true>::operator->(this_01);
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator*
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)(in_RDX + 0x11));
  CreatePlan((Binder *)local_b8,(BoundQueryNode *)pBVar2);
  uVar9 = 1;
  if (*(char *)&node[2].left.
                super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
                .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl == '\0') {
    pBVar2 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
    if (pBVar2->has_unplanned_dependent_joins == false) {
      pBVar2 = shared_ptr<duckdb::Binder,_true>::operator->
                         ((shared_ptr<duckdb::Binder,_true> *)local_58._M_nxt);
      uVar9 = pBVar2->has_unplanned_dependent_joins;
    }
  }
  *(undefined1 *)
   &node[2].left.
    super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t.
    super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
    super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl = uVar9;
  pBVar3 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
           operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                       *)(in_RDX + 0x10));
  local_68 = (__buckets_ptr)local_b8._8_8_;
  local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CastLogicalOperatorToTypes
            ((Binder *)local_a0,(vector<duckdb::LogicalType,_true> *)node,&pBVar3->types,in_RDX + 8)
  ;
  this_02._M_nxt = local_58._M_nxt;
  uVar1 = local_b8._8_8_;
  local_b8._8_8_ = local_a0._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(*(_func_int ***)uVar1)[1])();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(*(_func_int ***)local_68)[1])();
  }
  local_68 = (__buckets_ptr)0x0;
  pBVar3 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
           operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                       *)(in_RDX + 0x11));
  local_a0._48_8_ = local_b8._0_8_;
  local_b8._0_8_ = (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
  CastLogicalOperatorToTypes
            ((Binder *)local_a0,(vector<duckdb::LogicalType,_true> *)node,&pBVar3->types,in_RDX + 8)
  ;
  uVar1 = local_b8._0_8_;
  local_b8._0_8_ = local_a0._0_8_;
  if ((__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)uVar1
      != (__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         0x0) {
    (**(code **)(*(long *)uVar1 + 8))();
  }
  if ((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
      local_a0._48_8_ != (LogicalOperator *)0x0) {
    (**(code **)(*(long *)local_a0._48_8_ + 8))();
  }
  local_a0._48_8_ = (__node_base_ptr)0x0;
  pBVar2 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)this_02._M_nxt);
  pBVar8 = (BoundQueryNode *)(in_RDX + 0xb);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "recurring.",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pBVar8);
  pmVar4 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&pBVar2->bind_context,(key_type *)local_a0);
  if ((pmVar4->internal).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    bVar10 = false;
  }
  else {
    pBVar2 = shared_ptr<duckdb::Binder,_true>::operator->
                       ((shared_ptr<duckdb::Binder,_true> *)this_02._M_nxt);
    ::std::operator+(&local_50,"recurring.",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pBVar8);
    pmVar4 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pBVar2->bind_context,&local_50);
    puVar5 = shared_ptr<unsigned_long,_true>::operator*(pmVar4);
    bVar10 = *puVar5 != 0;
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  ::std::__cxx11::string::~string((string *)local_a0);
  if ((in_RDX[0x12].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl ==
       in_RDX[0x13].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl) && (bVar10 != false))
  {
    this_03 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)local_a0,"RECURRING can only be used with USING KEY in recursive CTE.",
               (allocator *)&local_50);
    InvalidInputException::InvalidInputException(this_03,(string *)local_a0);
    __cxa_throw(this_03,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pBVar2 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)this_02._M_nxt);
  pmVar4 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&pBVar2->bind_context,(key_type *)pBVar8);
  if ((pmVar4->internal).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
LAB_00a5bd9e:
    if (bVar10 == false) {
      pBVar8 = (BoundQueryNode *)(in_RDX + 0x15);
      local_50._M_dataplus._M_p =
           (pointer)(((long)in_RDX[9].
                            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl -
                     (long)in_RDX[8].
                           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl) /
                    0x18);
      local_a1 = LOGICAL_UNION;
      local_a2 = true;
      make_uniq<duckdb::LogicalSetOperation,unsigned_long&,unsigned_long,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,duckdb::LogicalOperatorType,bool>
                ((duckdb *)local_a0,(unsigned_long *)pBVar8,(unsigned_long *)&local_50,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)(local_b8 + 8),
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)local_b8,&local_a1,&local_a2);
      _Var7._M_head_impl = local_60._M_head_impl;
      local_a0._40_8_ = local_a0._0_8_;
      local_a0._0_8_ = (element_type *)0x0;
      VisitQueryNode((Binder *)local_60._M_head_impl,pBVar8,in_RDX);
      if ((element_type *)local_a0._40_8_ != (element_type *)0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_a0._40_8_)->__weak_this_).
                    internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      local_a0._40_8_ = (_Hash_node_base *)0x0;
      goto LAB_00a5bebb;
    }
  }
  else {
    pBVar2 = shared_ptr<duckdb::Binder,_true>::operator->
                       ((shared_ptr<duckdb::Binder,_true> *)this_02._M_nxt);
    pmVar4 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pBVar2->bind_context,(key_type *)pBVar8);
    puVar5 = shared_ptr<unsigned_long,_true>::operator*(pmVar4);
    if (*puVar5 == 0) goto LAB_00a5bd9e;
  }
  local_50._M_dataplus._M_p =
       (pointer)(((long)in_RDX[9].
                        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl -
                 (long)in_RDX[8].
                       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl) / 0x18
                );
  make_uniq<duckdb::LogicalRecursiveCTE,std::__cxx11::string&,unsigned_long&,unsigned_long,bool&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
            ((duckdb *)local_a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pBVar8,
             (unsigned_long *)(in_RDX + 0x15),(unsigned_long *)&local_50,(bool *)(in_RDX + 0xf),
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)(in_RDX + 0x12),
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)(local_b8 + 8),
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)local_b8);
  pLVar6 = unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
           ::operator->((unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
                         *)local_a0);
  _Var7._M_head_impl = local_60._M_head_impl;
  local_a0._32_8_ = local_a0._0_8_;
  (pLVar6->super_LogicalOperator).field_0x62 = bVar10;
  local_a0._0_8_ = (element_type *)0x0;
  VisitQueryNode((Binder *)local_60._M_head_impl,pBVar8,in_RDX);
  if ((element_type *)local_a0._32_8_ != (element_type *)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_a0._32_8_)->__weak_this_).
                internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  local_a0._32_8_ = 0;
LAB_00a5bebb:
  if ((element_type *)local_a0._0_8_ != (element_type *)0x0) {
    (*(code *)(*(__node_base_ptr *)local_a0._0_8_)[1]._M_nxt)();
  }
  if ((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
      local_b8._0_8_ != (LogicalOperator *)0x0) {
    (**(code **)(*(long *)local_b8._0_8_ + 8))();
  }
  if ((element_type *)local_b8._8_8_ != (element_type *)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_b8._8_8_)->__weak_this_).internal
                .super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         _Var7._M_head_impl;
}

Assistant:

unique_ptr<LogicalOperator> Binder::CreatePlan(BoundRecursiveCTENode &node) {
	// Generate the logical plan for the left and right sides of the set operation
	node.left_binder->is_outside_flattened = is_outside_flattened;
	node.right_binder->is_outside_flattened = is_outside_flattened;

	auto left_node = node.left_binder->CreatePlan(*node.left);
	auto right_node = node.right_binder->CreatePlan(*node.right);

	// check if there are any unplanned subqueries left in either child
	has_unplanned_dependent_joins = has_unplanned_dependent_joins || node.left_binder->has_unplanned_dependent_joins ||
	                                node.right_binder->has_unplanned_dependent_joins;

	// for both the left and right sides, cast them to the same types
	left_node = CastLogicalOperatorToTypes(node.left->types, node.types, std::move(left_node));
	right_node = CastLogicalOperatorToTypes(node.right->types, node.types, std::move(right_node));

	bool ref_recurring = node.right_binder->bind_context.cte_references["recurring." + node.ctename] &&
	                     *node.right_binder->bind_context.cte_references["recurring." + node.ctename] != 0;

	if (node.key_targets.empty() && ref_recurring) {
		throw InvalidInputException("RECURRING can only be used with USING KEY in recursive CTE.");
	}

	// Check if there is a reference to the recursive or recurring table, if not create a set operator.
	if ((!node.right_binder->bind_context.cte_references[node.ctename] ||
	     *node.right_binder->bind_context.cte_references[node.ctename] == 0) &&
	    !ref_recurring) {
		auto root = make_uniq<LogicalSetOperation>(node.setop_index, node.types.size(), std::move(left_node),
		                                           std::move(right_node), LogicalOperatorType::LOGICAL_UNION, true);
		return VisitQueryNode(node, std::move(root));
	}

	auto root =
	    make_uniq<LogicalRecursiveCTE>(node.ctename, node.setop_index, node.types.size(), node.union_all,
	                                   std::move(node.key_targets), std::move(left_node), std::move(right_node));
	root->ref_recurring = ref_recurring;
	return VisitQueryNode(node, std::move(root));
}